

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::setPushConstantRanges
          (ShaderRenderCaseInstance *this,deUint32 rangeCount,VkPushConstantRange *pcRanges)

{
  pointer pVVar1;
  ulong uVar2;
  bool bVar3;
  
  pVVar1 = (this->m_pushConstantRanges).
           super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_pushConstantRanges).
      super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->m_pushConstantRanges).
    super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  uVar2 = (ulong)rangeCount;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::push_back
              (&this->m_pushConstantRanges,pcRanges);
    pcRanges = pcRanges + 1;
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::setPushConstantRanges (const deUint32 rangeCount, const vk::VkPushConstantRange* const pcRanges)
{
	m_pushConstantRanges.clear();
	for (deUint32 i = 0; i < rangeCount; ++i)
	{
		m_pushConstantRanges.push_back(pcRanges[i]);
	}
}